

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O3

bool __thiscall deqp::gles31::SSBOLayoutCase::execute(SSBOLayoutCase *this,deUint32 program)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  GLuint index;
  GLenum GVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  void *pvVar4;
  TestError *pTVar5;
  Buffer acBuffer;
  InterfaceBlockInfo acBufferInfo;
  InterfaceVariableInfo info;
  vector<unsigned_char,_std::allocator<unsigned_char>_> emptyData;
  allocator_type local_262;
  value_type_conflict5 local_261;
  ObjectWrapper local_260;
  InterfaceBlockInfo local_248;
  InterfaceVariableInfo local_200;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  Functions *gl;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  index = (*gl->getProgramResourceIndex)(program,0x92e1,"ac_numPassed");
  paVar1 = &local_200.name.field_2;
  local_200.name._M_string_length = 0;
  local_200.name.field_2._M_local_buf[0] = '\0';
  local_200.index = 0xffffffff;
  local_200.blockIndex = 0xffffffff;
  local_200.atomicCounterBufferIndex = 0xffffffff;
  local_200.type = 0;
  local_200.arraySize = 0;
  local_200.offset = 0;
  local_200.arrayStride = 0;
  local_200._60_5_ = 0;
  local_200._65_8_ = 0;
  local_200.name._M_dataplus._M_p = (pointer)paVar1;
  if (index != 0xffffffff) {
    glu::getProgramInterfaceVariableInfo(gl,program,0x92e1,index,&local_200);
    if (local_200.atomicCounterBufferIndex != 0xffffffff) {
      local_248.name._M_dataplus._M_p = (pointer)&local_248.name.field_2;
      local_248.name._M_string_length = 0;
      local_248.name.field_2._M_local_buf[0] = '\0';
      local_248.index = 0xffffffff;
      local_248.bufferBinding = 0;
      local_248.dataSize = 0;
      local_248.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      glu::getProgramInterfaceBlockInfo
                (gl,program,0x92c0,local_200.atomicCounterBufferIndex,&local_248);
      goto LAB_01699435;
    }
  }
  local_248.name._M_dataplus._M_p = (pointer)&local_248.name.field_2;
  local_248.name._M_string_length = 0;
  local_248.name.field_2._M_local_buf[0] = '\0';
  local_248.index = 0xffffffff;
  local_248.bufferBinding = 0;
  local_248.dataSize = 0;
  local_248.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_01699435:
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_260,(Functions *)CONCAT44(extraout_var_00,iVar2),traits);
  if (index == 0xffffffff) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0 = (undefined1  [8])local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"No location for ac_numPassed found","");
    tcu::TestError::TestError(pTVar5,(string *)local_1b0);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (local_248.index == 0xffffffff) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0 = (undefined1  [8])local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"ac_numPassed buffer index is GL_INVALID_INDEX","");
    tcu::TestError::TestError(pTVar5,(string *)local_1b0);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if ((ulong)local_248.dataSize == 0) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0 = (undefined1  [8])local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"ac_numPassed buffer size = 0","");
    tcu::TestError::TestError(pTVar5,(string *)local_1b0);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_261 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0,
             (ulong)local_248.dataSize,&local_261,&local_262);
  (*gl->bindBuffer)(0x92c0,local_260.m_object);
  (*gl->bufferData)(0x92c0,(long)local_1a8 - (long)local_1b0,(void *)local_1b0,0x88e5);
  (*gl->bindBufferBase)(0x92c0,local_248.index,local_260.m_object);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"Setting up buffer for ac_numPassed failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                  ,0xa45);
  if (local_1b0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity - (long)local_1b0);
  }
  (*gl->useProgram)(program);
  (*gl->dispatchCompute)(1,1,1);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glDispatchCompute() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                  ,0xa4a);
  pvVar4 = (*gl->mapBufferRange)(0x92c0,0,(ulong)local_248.dataSize,1);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                  ,0xa52);
  if (pvVar4 != (void *)0x0) {
    iVar2 = *(int *)((long)pvVar4 + (ulong)local_200.offset);
    (*gl->unmapBuffer)(0x92c0);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                    ,0xa58);
    if (iVar2 != 1) {
      local_1b0 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"ERROR: ac_numPassed = ",0x16);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", expected ",0xb);
      std::ostream::operator<<((ostringstream *)&local_1a8,1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"Shader execution failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                    ,0xa61);
    glu::ObjectWrapper::~ObjectWrapper(&local_260);
    if (local_248.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_248.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248.name._M_dataplus._M_p != &local_248.name.field_2) {
      operator_delete(local_248.name._M_dataplus._M_p,
                      CONCAT71(local_248.name.field_2._M_allocated_capacity._1_7_,
                               local_248.name.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.name._M_dataplus._M_p,
                      CONCAT71(local_200.name.field_2._M_allocated_capacity._1_7_,
                               local_200.name.field_2._M_local_buf[0]) + 1);
    }
    return iVar2 == 1;
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,(char *)0x0,"mapPtr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
             ,0xa53);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool SSBOLayoutCase::execute (deUint32 program)
{
	const glw::Functions&				gl				= m_renderCtx.getFunctions();
	const deUint32						numPassedLoc	= gl.getProgramResourceIndex(program, GL_UNIFORM, "ac_numPassed");
	const glu::InterfaceVariableInfo	acVarInfo		= numPassedLoc != GL_INVALID_INDEX ? glu::getProgramInterfaceVariableInfo(gl, program, GL_UNIFORM, numPassedLoc)
																						   : glu::InterfaceVariableInfo();
	const glu::InterfaceBlockInfo		acBufferInfo	= acVarInfo.atomicCounterBufferIndex != GL_INVALID_INDEX ? glu::getProgramInterfaceBlockInfo(gl, program, GL_ATOMIC_COUNTER_BUFFER, acVarInfo.atomicCounterBufferIndex)
																												 : glu::InterfaceBlockInfo();
	const glu::Buffer					acBuffer		(m_renderCtx);
	bool								isOk			= true;

	if (numPassedLoc == GL_INVALID_INDEX)
		throw tcu::TestError("No location for ac_numPassed found");

	if (acBufferInfo.index == GL_INVALID_INDEX)
		throw tcu::TestError("ac_numPassed buffer index is GL_INVALID_INDEX");

	if (acBufferInfo.dataSize == 0)
		throw tcu::TestError("ac_numPassed buffer size = 0");

	// Initialize atomic counter buffer.
	{
		vector<deUint8> emptyData(acBufferInfo.dataSize, 0);

		gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, *acBuffer);
		gl.bufferData(GL_ATOMIC_COUNTER_BUFFER, (glw::GLsizeiptr)emptyData.size(), &emptyData[0], GL_STATIC_READ);
		gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, acBufferInfo.index, *acBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Setting up buffer for ac_numPassed failed");
	}

	gl.useProgram(program);
	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute() failed");

	// Read back ac_numPassed data.
	{
		const void*	mapPtr		= gl.mapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, acBufferInfo.dataSize, GL_MAP_READ_BIT);
		const int	refCount	= 1;
		int			resCount	= 0;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER) failed");
		TCU_CHECK(mapPtr);

		resCount = *(const int*)((const deUint8*)mapPtr + acVarInfo.offset);

		gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER) failed");

		if (refCount != resCount)
		{
			m_testCtx.getLog() << TestLog::Message << "ERROR: ac_numPassed = " << resCount << ", expected " << refCount << TestLog::EndMessage;
			isOk = false;
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Shader execution failed");

	return isOk;
}